

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

CuboidMedium<pbrt::UniformGridMediumProvider> *
pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>::Create
          (UniformGridMediumProvider *provider,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  TVar1;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  TVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CuboidMedium<pbrt::UniformGridMediumProvider> *pCVar5;
  allocator<char> local_b9;
  Float g;
  Float local_b4;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  string local_a0;
  Float sigScale;
  undefined4 uStack_7c;
  UniformGridMediumProvider *provider_local;
  Allocator alloc_local;
  string preset;
  size_t local_30 [2];
  
  sig_a.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  sig_s.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  provider_local = provider;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"preset",(allocator<char> *)&g);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sigScale,"",&local_b9);
  ParameterDictionary::GetOneString(&preset,parameters,&local_a0,(string *)&sigScale);
  std::__cxx11::string::~string((string *)&sigScale);
  std::__cxx11::string::~string((string *)&local_a0);
  if (preset._M_string_length != 0) {
    bVar3 = GetMediumScatteringProperties(&preset,&sig_a,&sig_s,alloc);
    if (!bVar3) {
      Warning<std::__cxx11::string&>(loc,"Material preset \"%s\" not found.",&preset);
    }
  }
  if (sig_a.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"sigma_a",(allocator<char> *)&g);
    local_30[1] = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)&sigScale,(string *)parameters,(SpectrumHandle *)&local_a0,
               (SpectrumType)(local_30 + 1),(Allocator)0x1);
    TVar1.bits._4_4_ = uStack_7c;
    TVar1.bits._0_4_ = sigScale;
    sig_a.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )TVar1.bits;
    std::__cxx11::string::~string((string *)&local_a0);
    if (TVar1.bits == 0) {
      iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
      *(undefined4 *)CONCAT44(extraout_var,iVar4) = 0x3f800000;
      sig_a.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )(CONCAT44(extraout_var,iVar4) | 0x1000000000000);
    }
  }
  if (sig_s.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"sigma_s",(allocator<char> *)&g);
    local_30[0] = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)&sigScale,(string *)parameters,(SpectrumHandle *)&local_a0,
               (SpectrumType)local_30,(Allocator)0x1);
    TVar2.bits._4_4_ = uStack_7c;
    TVar2.bits._0_4_ = sigScale;
    sig_s.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )TVar2.bits;
    std::__cxx11::string::~string((string *)&local_a0);
    if (TVar2.bits == 0) {
      iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
      *(undefined4 *)CONCAT44(extraout_var_00,iVar4) = 0x3f800000;
      sig_s.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )(CONCAT44(extraout_var_00,iVar4) | 0x1000000000000);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"scale",(allocator<char> *)&g);
  local_b4 = ParameterDictionary::GetOneFloat(parameters,&local_a0,1.0);
  std::__cxx11::string::~string((string *)&local_a0);
  sigScale = local_b4;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"g",&local_b9);
  local_b4 = ParameterDictionary::GetOneFloat(parameters,&local_a0,0.0);
  std::__cxx11::string::~string((string *)&local_a0);
  g = local_b4;
  pCVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,pbrt::UniformGridMediumProvider_const*&,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,float&,float&,pbrt::Transform_const&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&provider_local,&sig_a,&sig_s,&sigScale,&g,renderFromMedium,
                      &alloc_local);
  std::__cxx11::string::~string((string *)&preset);
  return pCVar5;
}

Assistant:

static CuboidMedium<Provider> *Create(const Provider *provider,
                                          const ParameterDictionary &parameters,
                                          const Transform &renderFromMedium,
                                          const FileLoc *loc, Allocator alloc) {
        SpectrumHandle sig_a = nullptr, sig_s = nullptr;
        std::string preset = parameters.GetOneString("preset", "");
        if (!preset.empty()) {
            if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
                Warning(loc, "Material preset \"%s\" not found.", preset);
        }

        if (sig_a == nullptr) {
            sig_a = parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded,
                                              alloc);
            if (sig_a == nullptr)
                sig_a = alloc.new_object<ConstantSpectrum>(1.f);
        }
        if (sig_s == nullptr) {
            sig_s = parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded,
                                              alloc);
            if (sig_s == nullptr)
                sig_s = alloc.new_object<ConstantSpectrum>(1.f);
        }

        Float sigScale = parameters.GetOneFloat("scale", 1.f);

        Float g = parameters.GetOneFloat("g", 0.0f);

        return alloc.new_object<CuboidMedium<Provider>>(provider, sig_a, sig_s, sigScale,
                                                        g, renderFromMedium, alloc);
    }